

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprReferencesUpdatedColumn(Expr *pExpr,int *aiChng,int chngRowid)

{
  undefined1 local_50 [8];
  Walker w;
  int chngRowid_local;
  int *aiChng_local;
  Expr *pExpr_local;
  
  w.u._4_4_ = chngRowid;
  memset(local_50,0,0x30);
  w.xSelectCallback2._4_2_ = 0;
  w.pParse = (Parse *)checkConstraintExprNode;
  w._32_8_ = aiChng;
  sqlite3WalkExpr((Walker *)local_50,pExpr);
  if (w.u._4_4_ == 0) {
    w.xSelectCallback2._4_2_ = w.xSelectCallback2._4_2_ & 0xfffd;
  }
  return (int)(w.xSelectCallback2._4_2_ != 0);
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprReferencesUpdatedColumn(
  Expr *pExpr,    /* The expression to be checked */
  int *aiChng,    /* aiChng[x]>=0 if column x changed by the UPDATE */
  int chngRowid   /* True if UPDATE changes the rowid */
){
  Walker w;
  memset(&w, 0, sizeof(w));
  w.eCode = 0;
  w.xExprCallback = checkConstraintExprNode;
  w.u.aiCol = aiChng;
  sqlite3WalkExpr(&w, pExpr);
  if( !chngRowid ){
    testcase( (w.eCode & CKCNSTRNT_ROWID)!=0 );
    w.eCode &= ~CKCNSTRNT_ROWID;
  }
  testcase( w.eCode==0 );
  testcase( w.eCode==CKCNSTRNT_COLUMN );
  testcase( w.eCode==CKCNSTRNT_ROWID );
  testcase( w.eCode==(CKCNSTRNT_ROWID|CKCNSTRNT_COLUMN) );
  return w.eCode!=0;
}